

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QExplicitlySharedDataPointer<QEventPointPrivate>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QEventPointPrivate> *this)

{
  QEventPointPrivate *pQVar1;
  Data *pDVar2;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QEventPointPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int> == 0) &&
       (pQVar1 = (this->d).ptr, pQVar1 != (QEventPointPrivate *)0x0)) {
      pDVar2 = (pQVar1->target).wp.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
           (pDVar2 = (pQVar1->target).wp.d, pDVar2 != (Data *)0x0)) {
          operator_delete(pDVar2);
        }
      }
      pDVar2 = (pQVar1->window).wp.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
           (pDVar2 = (pQVar1->window).wp.d, pDVar2 != (Data *)0x0)) {
          operator_delete(pDVar2);
        }
      }
      operator_delete(pQVar1,0xe0);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }